

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<int,_void>::InnerLeaf<2>::InnerLeaf<1>(InnerLeaf<2> *this,InnerLeaf<1> *other)

{
  const_iterator __n;
  HighsHashTableEntry<int,_void> *__x;
  iterator __first;
  uint64_t *in_RSI;
  Occupation *in_RDI;
  unsigned_long *in_stack_ffffffffffffffd0;
  unsigned_long *in_stack_ffffffffffffffe0;
  
  Occupation::Occupation(in_RDI);
  in_RDI->occupation = *in_RSI;
  *(int *)&in_RDI[1].occupation = (int)in_RSI[1];
  __n = std::array<unsigned_long,_7UL>::cbegin((array<unsigned_long,_7UL> *)0x571a96);
  std::array<unsigned_long,_7UL>::cbegin((array<unsigned_long,_7UL> *)0x571aa8);
  __x = (HighsHashTableEntry<int,_void> *)
        std::next<unsigned_long_const*>(in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<unsigned_long,_23UL>::begin((array<unsigned_long,_23UL> *)0x571ad1);
  std::copy<unsigned_long_const*,unsigned_long*>
            (in_stack_ffffffffffffffe0,&in_RDI->occupation,(unsigned_long *)__x);
  __first = std::array<HighsHashTableEntry<int,_void>,_6UL>::begin
                      ((array<HighsHashTableEntry<int,_void>,_6UL> *)0x571af0);
  std::array<HighsHashTableEntry<int,_void>,_6UL>::begin
            ((array<HighsHashTableEntry<int,_void>,_6UL> *)0x571b03);
  std::next<HighsHashTableEntry<int,void>*>(__x,(difference_type)__n);
  std::array<HighsHashTableEntry<int,_void>,_22UL>::begin
            ((array<HighsHashTableEntry<int,_void>,_22UL> *)0x571b2a);
  std::move<HighsHashTableEntry<int,void>*,HighsHashTableEntry<int,void>*>
            (__first,(HighsHashTableEntry<int,_void> *)in_RDI,__x);
  return;
}

Assistant:

InnerLeaf(InnerLeaf<kOtherSize>&& other) {
      assert(other.size <= capacity());
      occupation = other.occupation;
      size = other.size;
      std::copy(other.hashes.cbegin(),
                std::next(other.hashes.cbegin(), size + 1), hashes.begin());
      std::move(other.entries.begin(), std::next(other.entries.begin(), size),
                entries.begin());
    }